

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O1

void __thiscall argo::unparser::unparse(unparser *this,json *j,int indent_level)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  string *psVar4;
  writer *pwVar5;
  json_exception *this_00;
  char *pcVar6;
  _Alloc_hider _Var7;
  double d;
  string local_40;
  
  psVar4 = json::get_raw_value_abi_cxx11_(j);
  iVar2 = std::__cxx11::string::compare((char *)psVar4);
  tVar3 = json::get_instance_type(j);
  if (iVar2 != 0) {
    pwVar5 = this->m_writer;
    if (tVar3 == string_e) {
      pwVar5 = operator<<(pwVar5,'\"');
      psVar4 = json::get_raw_value_abi_cxx11_(j);
      pwVar5 = operator<<(pwVar5,psVar4);
      operator<<(pwVar5,'\"');
      return;
    }
    psVar4 = json::get_raw_value_abi_cxx11_(j);
    operator<<(pwVar5,psVar4);
    return;
  }
  switch(tVar3) {
  case object_e:
    unparse_object(this,j,indent_level);
    return;
  case array_e:
    unparse_array(this,j,indent_level);
    return;
  case boolean_e:
    pwVar5 = this->m_writer;
    bVar1 = json::operator_cast_to_bool(j);
    pcVar6 = "false";
    if (bVar1) {
      pcVar6 = "true";
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,pcVar6,pcVar6 + ((ulong)bVar1 ^ 5));
    operator<<(pwVar5,&local_40);
    _Var7._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
    break;
  case null_e:
    pwVar5 = this->m_writer;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"null","");
    operator<<(pwVar5,&local_40);
    _Var7._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
    break;
  case number_int_e:
    pwVar5 = this->m_writer;
    iVar2 = json::operator_cast_to_int(j);
    operator<<(pwVar5,iVar2);
    return;
  case number_double_e:
    pwVar5 = this->m_writer;
    d = json::operator_cast_to_double(j);
    operator<<(pwVar5,d);
    return;
  case string_e:
    pwVar5 = operator<<(this->m_writer,'\"');
    psVar4 = json::operator_cast_to_string_(j);
    utf8::utf8_to_json_string((utf8 *)&local_40,psVar4);
    pwVar5 = operator<<(pwVar5,(string *)local_40._M_dataplus._M_p);
    operator<<(pwVar5,'\"');
    _Var7._M_p = local_40._M_dataplus._M_p;
    if ((string *)local_40._M_dataplus._M_p == (string *)0x0) {
      return;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(char **)local_40._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_40._M_dataplus._M_p + 0x10)) {
      operator_delete(*(char **)local_40._M_dataplus._M_p);
    }
    break;
  default:
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_exception::json_exception(this_00,invalid_json_type_e);
    __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
  }
  operator_delete(_Var7._M_p);
  return;
}

Assistant:

void unparser::unparse(const json &j, int indent_level)
{
    if (j.get_raw_value() == "")
    {
        switch (j.get_instance_type())
        {
        case json::object_e:
            unparse_object(j, indent_level);
            break;
        case json::array_e:
            unparse_array(j, indent_level);
            break;
        case json::boolean_e:
            m_writer << (static_cast<bool>(j) ? "true" : "false");
            break;
        case json::null_e:
            m_writer << "null";
            break;
        case json::number_int_e:
            m_writer << static_cast<int>(j);
            break;
        case json::number_double_e:
            m_writer << static_cast<double>(j);
            break;
        case json::string_e:
            m_writer << '"' << *(utf8::utf8_to_json_string(j)) << '"';
            break;
        default:
            throw json_exception(json_exception::invalid_json_type_e);
        }
    }
    else
    {
        if (j.get_instance_type() == json::string_e)
        {
            m_writer << '"' << j.get_raw_value() << '"';
        }
        else
        {
            m_writer << j.get_raw_value();
        }
    }
}